

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

string_view __thiscall
wabt::anon_unknown_11::NameApplier::FindLabelByVar(NameApplier *this,Var *var)

{
  __type _Var1;
  string *__rhs;
  char *pcVar2;
  int in_EDX;
  size_type sVar3;
  Var *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar4;
  long lVar5;
  pointer pcVar6;
  string_view sVar7;
  
  if (var->type_ == Name) {
    uVar4 = (ulong)((long)(this->labels_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->labels_).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
    pcVar6 = (pointer)0x0;
    do {
      uVar4 = uVar4 - 1;
      if ((int)(uint)uVar4 < 0) {
        sVar3 = 0;
        goto LAB_0015a821;
      }
      __lhs = (this->labels_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + ((uint)uVar4 & 0x7fffffff);
      __rhs = Var::name_abi_cxx11_(var);
      _Var1 = std::operator==(__lhs,__rhs);
    } while (!_Var1);
  }
  else {
    __s = var;
    pcVar2 = Var::index(var,(char *)var,in_EDX);
    lVar5 = (long)(this->labels_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->labels_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pcVar6 = (pointer)0x0;
    sVar3 = 0;
    if ((ulong)(lVar5 >> 5) <= ((ulong)pcVar2 & 0xffffffff)) goto LAB_0015a821;
    pcVar2 = Var::index(var,(char *)__s,0);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)(this->labels_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
            ~((ulong)pcVar2 & 0xffffffff) * 0x20 + lVar5);
  }
  pcVar6 = (__lhs->_M_dataplus)._M_p;
  sVar3 = __lhs->_M_string_length;
LAB_0015a821:
  sVar7.size_ = sVar3;
  sVar7.data_ = pcVar6;
  return sVar7;
}

Assistant:

string_view NameApplier::FindLabelByVar(Var* var) {
  if (var->is_name()) {
    for (int i = labels_.size() - 1; i >= 0; --i) {
      const std::string& label = labels_[i];
      if (label == var->name()) {
        return label;
      }
    }
    return string_view();
  } else {
    if (var->index() >= labels_.size()) {
      return string_view();
    }
    return labels_[labels_.size() - 1 - var->index()];
  }
}